

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int listener_get(nng_listener lid,char *name,void *v,size_t *szp,nni_type t)

{
  int iVar1;
  nni_listener *local_30;
  nni_listener *l;
  
  iVar1 = nni_listener_find(&local_30,lid.id);
  if (iVar1 == 0) {
    iVar1 = nni_listener_getopt(local_30,name,v,(size_t *)0x0,(nni_type)szp);
    nni_listener_rele(local_30);
  }
  return iVar1;
}

Assistant:

static int
listener_get(
    nng_listener lid, const char *name, void *v, size_t *szp, nni_type t)
{
	nni_listener *l;
	int           rv;

	if ((rv = nni_listener_find(&l, lid.id)) != 0) {
		return (rv);
	}
	rv = nni_listener_getopt(l, name, v, szp, t);
	nni_listener_rele(l);
	return (rv);
}